

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_si_iec_units.cpp
# Opt level: O3

bool tlx::parse_si_iec_units(char *str,uint64_t *out_size,char default_unit)

{
  byte *pbVar1;
  byte bVar2;
  bool bVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  byte *pbVar8;
  char *local_20;
  
  uVar4 = strtoul(str,&local_20,10);
  *out_size = uVar4;
  if (local_20 == (char *)0x0) {
    return false;
  }
  for (pbVar8 = (byte *)(local_20 + 2); bVar2 = pbVar8[-2], bVar2 == 0x20; pbVar8 = pbVar8 + 1) {
  }
  if (bVar2 < 0x67) {
    switch(bVar2) {
    case 0x4b:
switchD_00151a93_caseD_4b:
      iVar5 = 1;
      break;
    case 0x4c:
    case 0x4e:
    case 0x4f:
    case 0x51:
    case 0x52:
    case 0x53:
      goto switchD_00151a93_caseD_4c;
    case 0x4d:
switchD_00151a93_caseD_4d:
      iVar5 = 2;
      break;
    case 0x50:
switchD_00151a93_caseD_50:
      iVar5 = 5;
      break;
    case 0x54:
switchD_00151a93_caseD_54:
      iVar5 = 4;
      break;
    default:
      if (bVar2 != 0x47) goto switchD_00151a93_caseD_4c;
LAB_00151b16:
      iVar5 = 3;
    }
    bVar2 = pbVar8[-1];
    if ((bVar2 | 0x20) == 0x69) {
      bVar2 = *pbVar8;
      uVar6 = 0x400;
      bVar3 = false;
    }
    else {
      uVar6 = 1000;
      bVar3 = false;
      pbVar8 = pbVar8 + -1;
    }
  }
  else {
    switch(bVar2) {
    case 0x6b:
      goto switchD_00151a93_caseD_4b;
    case 0x6c:
    case 0x6e:
    case 0x6f:
    case 0x71:
    case 0x72:
    case 0x73:
      break;
    case 0x6d:
      goto switchD_00151a93_caseD_4d;
    case 0x70:
      goto switchD_00151a93_caseD_50;
    case 0x74:
      goto switchD_00151a93_caseD_54;
    default:
      if (bVar2 == 0x67) goto LAB_00151b16;
    }
switchD_00151a93_caseD_4c:
    pbVar8 = pbVar8 + -2;
    uVar6 = 1000;
    bVar3 = true;
    iVar5 = 0;
  }
  if ((bVar2 | 0x20) == 0x62) {
    pbVar8 = pbVar8 + 1;
  }
  else if (bVar3) {
    iVar7 = (int)default_unit;
    iVar5 = 0;
    if (iVar7 < 0x67) {
      iVar5 = 0;
      switch(iVar7) {
      case 0x4b:
        iVar5 = 1;
        break;
      case 0x4c:
      case 0x4e:
      case 0x4f:
      case 0x51:
      case 0x52:
      case 0x53:
        goto switchD_00151bbe_caseD_4c;
      case 0x4d:
        iVar5 = 2;
        break;
      case 0x50:
        iVar5 = 5;
        break;
      case 0x54:
        iVar5 = 4;
        break;
      default:
        if (iVar7 != 0x47) goto switchD_00151bbe_caseD_4c;
        iVar5 = 3;
      }
      uVar6 = 0x400;
    }
    else {
      switch(iVar7) {
      case 0x6b:
        iVar5 = 1;
        break;
      case 0x6c:
      case 0x6e:
      case 0x6f:
      case 0x71:
      case 0x72:
      case 0x73:
        goto switchD_00151bbe_caseD_4c;
      case 0x6d:
        iVar5 = 2;
        break;
      case 0x70:
        iVar5 = 5;
        break;
      case 0x74:
        iVar5 = 4;
        break;
      default:
        if (iVar7 != 0x67) goto switchD_00151bbe_caseD_4c;
        iVar5 = 3;
      }
      uVar6 = 1000;
    }
  }
switchD_00151bbe_caseD_4c:
  pbVar8 = pbVar8 + -1;
  do {
    pbVar1 = pbVar8 + 1;
    pbVar8 = pbVar8 + 1;
  } while (*pbVar1 == 0x20);
  if (iVar5 != 0) {
    do {
      uVar4 = uVar4 * uVar6;
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
    *out_size = uVar4;
  }
  return *pbVar8 == 0;
}

Assistant:

bool parse_si_iec_units(
    const char* str, uint64_t* out_size, char default_unit) {

    char* endptr;
    *out_size = strtoul(str, &endptr, 10);
    if (endptr == nullptr) return false;        // parse failed, no number

    while (*endptr == ' ') ++endptr;            // skip over spaces

    // multiply with base ^ power
    unsigned int base = 1000;
    unsigned int power = 0;

    if (*endptr == 'k' || *endptr == 'K')
        power = 1, ++endptr;
    else if (*endptr == 'm' || *endptr == 'M')
        power = 2, ++endptr;
    else if (*endptr == 'g' || *endptr == 'G')
        power = 3, ++endptr;
    else if (*endptr == 't' || *endptr == 'T')
        power = 4, ++endptr;
    else if (*endptr == 'p' || *endptr == 'P')
        power = 5, ++endptr;

    // switch to power of two (only if power was set above)
    if ((*endptr == 'i' || *endptr == 'I') && power != 0)
        base = 1024, ++endptr;

    // byte indicator
    if (*endptr == 'b' || *endptr == 'B') {
        ++endptr;
    }
    else if (power == 0)
    {
        // no explicit power indicator, and no 'b' or 'B' -> apply default unit
        switch (default_unit)
        {
        default: break;
        case 'k': power = 1, base = 1000;
            break;
        case 'm': power = 2, base = 1000;
            break;
        case 'g': power = 3, base = 1000;
            break;
        case 't': power = 4, base = 1000;
            break;
        case 'p': power = 5, base = 1000;
            break;
        case 'K': power = 1, base = 1024;
            break;
        case 'M': power = 2, base = 1024;
            break;
        case 'G': power = 3, base = 1024;
            break;
        case 'T': power = 4, base = 1024;
            break;
        case 'P': power = 5, base = 1024;
            break;
        }
    }

    // skip over spaces
    while (*endptr == ' ') ++endptr;

    // multiply size
    for (unsigned int p = 0; p < power; ++p)
        *out_size *= base;

    return (*endptr == 0);
}